

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O2

void __thiscall
zmq::radio_t::xattach_pipe
          (radio_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pipe_t *pipe__local;
  
  pipe__local = pipe_;
  if (pipe_ == (pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radio.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort("pipe_");
  }
  pipe_t::set_nodelay(pipe_);
  dist_t::attach(&this->_dist,pipe_);
  if (subscribe_to_all_) {
    std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back
              (&this->_udp_pipes,&pipe__local);
    return;
  }
  xread_activated(this,pipe_);
  return;
}

Assistant:

void zmq::radio_t::xattach_pipe (pipe_t *pipe_,
                                 bool subscribe_to_all_,
                                 bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    _dist.attach (pipe_);

    if (subscribe_to_all_)
        _udp_pipes.push_back (pipe_);
    //  The pipe is active when attached. Let's read the subscriptions from
    //  it, if any.
    else
        xread_activated (pipe_);
}